

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panel_code.cpp
# Opt level: O3

Am_Value Am_Copy_Item_To_Command_proc(Am_Object *self)

{
  Am_Value *in_value;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  Am_Object *in_RSI;
  Am_Value AVar1;
  
  *(undefined2 *)&self->data = 0;
  self[1].data = (Am_Object_Data *)0x0;
  in_value = Am_Object::Get(in_RSI,0xa3,1);
  Am_Value::operator=((Am_Value *)self,in_value);
  copy_item_to_command_proc(in_RSI,(Am_Value *)self);
  AVar1.value.wrapper_value = extraout_RDX.wrapper_value;
  AVar1._0_8_ = self;
  return AVar1;
}

Assistant:

Am_Define_Formula(Am_Value, Am_Copy_Item_To_Command)
{
  Am_Value value;
  value = self.Peek(Am_ITEM);
  // std::cout << "regular copy_item_to_command for " << self << " value = " << value
  //     <<std::endl <<std::flush;
  copy_item_to_command_proc(self, value);
  return value;
}